

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

Model * gvr::createModelFromContours(char *name,double scale,double height)

{
  Model *pl_00;
  ImageIO *in_RDI;
  ImageU8 *in_XMM0_Qa;
  char *in_XMM1_Qa;
  long in_stack_00000010;
  long in_stack_00000018;
  float in_stack_00000024;
  ImageU8 *in_stack_00000028;
  vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *in_stack_00000030;
  Mesh *mesh;
  vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> pl;
  ImageU8 image;
  undefined8 in_stack_ffffffffffffff48;
  long in_stack_ffffffffffffff50;
  Mesh *this;
  double in_stack_ffffffffffffff58;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffff60;
  Mesh *mesh_00;
  double in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            (in_stack_ffffffffffffff60,(long)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  gimage::getImageIO();
  this = (Mesh *)0xffffffffffffffff;
  gimage::ImageIO::load
            (in_RDI,in_XMM0_Qa,in_XMM1_Qa,in_stack_ffffffffffffffe4,(long)in_stack_ffffffffffffffd8,
             (long)in_stack_ffffffffffffffd0,in_stack_00000010,in_stack_00000018);
  mesh_00 = (Mesh *)&stack0xffffffffffffff88;
  std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::vector
            ((vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *)0x153b5a);
  gimage::extractContours(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  pl_00 = (Model *)operator_new(0xc0);
  Mesh::Mesh(this);
  createMeshFromContours
            (mesh_00,(vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *)pl_00,
             (double)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::~vector
            ((vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *)in_stack_ffffffffffffff60)
  ;
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
            (in_stack_ffffffffffffff60);
  return pl_00;
}

Assistant:

Model *createModelFromContours(const char *name, double scale, double height)
{
  // load image

  gimage::ImageU8 image;
  gimage::getImageIO().load(image, name);

  // extract contours

  std::vector<gimage::Polygon> pl;
  extractContours(pl, image, 0.25f);

  // create mesh from contours

  Mesh *mesh=new Mesh();

  try
  {
    createMeshFromContours(mesh, pl, scale, height);
  }
  catch (...)
  {
    delete mesh;
    throw;
  }

  return mesh;
}